

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpluginloader.cpp
# Opt level: O2

void __thiscall QPluginLoader::setFileName(QPluginLoader *this,QString *fileName)

{
  ulong pos;
  long lVar1;
  qsizetype qVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  qsizetype n;
  QString *pQVar6;
  QLoggingCategory *pQVar7;
  QDebug *pQVar8;
  QLibraryPrivate *pQVar9;
  QString *pQVar10;
  long lVar11;
  long lVar12;
  QFlagsStorage<QLibrary::LoadHint> loadHints;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_f8;
  undefined1 local_e0 [16];
  char *pcStack_d0;
  QArrayDataPointer<QString> local_c8;
  ulong local_a8;
  char16_t *pcStack_a0;
  QStringView local_98;
  QArrayDataPointer<QString> local_88;
  QFileInfo fi;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = this->d;
  if (pQVar9 == (QLibraryPrivate *)0x0) {
    loadHints.i = 8;
  }
  else {
    loadHints.i = (pQVar9->loadHintsInt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                  _q_value.super___atomic_base<int>._M_i;
    QLibraryPrivate::release(pQVar9);
    this->d = (QLibraryPrivate *)0x0;
    this->did_load = false;
  }
  local_f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  bVar4 = QDir::isAbsolutePath(fileName);
  if (bVar4) {
    fi.d_ptr.d.ptr._0_4_ = 0xaaaaaaaa;
    fi.d_ptr.d.ptr._4_4_ = 0xaaaaaaaa;
    QFileInfo::QFileInfo(&fi,fileName);
    bVar5 = QFileInfo::isFile(&fi);
    if (bVar5) {
      QFileInfo::canonicalFilePath((QString *)&local_f8,&fi);
      QFileInfo::~QFileInfo(&fi);
      goto LAB_002af912;
    }
    QFileInfo::~QFileInfo(&fi);
  }
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  fi.d_ptr.d.ptr._0_4_ = 0;
  fi.d_ptr.d.ptr._4_4_ = 0;
  QLibraryPrivate::suffixes_sys((QStringList *)&local_88,(QString *)&fi);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fi);
  fi.d_ptr.d.ptr._0_4_ = 0;
  fi.d_ptr.d.ptr._4_4_ = 0;
  QList<QString>::emplaceFront<QString>((QList<QString> *)&local_88,(QString *)&fi);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fi);
  n = QString::lastIndexOf(fileName,(QChar)0x2f,CaseSensitive);
  qVar2 = (fileName->d).size;
  fi.d_ptr.d.ptr._0_4_ = (undefined4)qVar2;
  fi.d_ptr.d.ptr._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
  pos = n + 1;
  local_98 = QStringView::mid((QStringView *)&fi,pos,-1);
  if (bVar4) {
    local_a8 = 0;
    pcStack_a0 = (char16_t *)0x0;
    local_c8.d = (Data *)0x0;
    local_c8.ptr = (QString *)0x0;
    local_c8.size = 0;
    QString::left((QString *)&fi,fileName,n);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_c8,(QString *)&fi);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fi);
  }
  else {
    uVar3 = (fileName->d).size;
    local_a8 = pos;
    if (uVar3 < pos) {
      local_a8 = uVar3;
    }
    pcStack_a0 = (fileName->d).ptr;
    local_c8.d = (Data *)0x0;
    local_c8.ptr = (QString *)0x0;
    local_c8.size = 0;
    QCoreApplication::libraryPaths();
    QArrayDataPointer<QString>::operator=(&local_c8,(QArrayDataPointer<QString> *)&fi);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&fi);
  }
  pQVar6 = local_c8.ptr + local_c8.size;
  for (pQVar10 = local_c8.ptr; pQVar10 != pQVar6; pQVar10 = pQVar10 + 1) {
    for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 0x10) {
      local_e0._8_8_ = *(undefined8 *)(&DAT_00666678 + lVar11);
      pcStack_d0 = *(char **)(&UNK_00666680 + lVar11);
      for (lVar12 = local_88.size * 0x18; lVar12 != 0; lVar12 = lVar12 + -0x18) {
        local_f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_f8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        fi.d_ptr.d.ptr._0_4_ = SUB84(pQVar10,0);
        fi.d_ptr.d.ptr._4_4_ = (undefined4)((ulong)pQVar10 >> 0x20);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QStringView_&>,_QStringView_&>,_const_QStringView_&>,_const_QString_&>
        ::convertTo<QString>
                  ((QString *)&local_f8,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QStringView_&>,_QStringView_&>,_const_QStringView_&>,_const_QString_&>
                    *)&fi);
        pQVar7 = QtPrivateLogging::qt_lcDebugPlugins();
        if (((pQVar7->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          fi.d_ptr.d.ptr._0_4_ = 2;
          fi.d_ptr.d.ptr._4_4_ = 0;
          QMessageLogger::debug((QMessageLogger *)local_e0);
          pQVar8 = QDebug::operator<<((QDebug *)local_e0,"Trying...");
          QDebug::operator<<(pQVar8,(QString *)&local_f8);
          QDebug::~QDebug((QDebug *)local_e0);
        }
        QFileInfo::QFileInfo(&fi,(QString *)&local_f8);
        bVar4 = QFileInfo::isFile(&fi);
        QFileInfo::~QFileInfo(&fi);
        if (bVar4) goto LAB_002af8fb;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
      }
    }
  }
  pQVar7 = QtPrivateLogging::qt_lcDebugPlugins();
  if (((pQVar7->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    fi.d_ptr.d.ptr._0_4_ = 2;
    fi.d_ptr.d.ptr._4_4_ = 0;
    QMessageLogger::debug((QMessageLogger *)(local_e0 + 8));
    pQVar8 = QDebug::operator<<((QDebug *)(local_e0 + 8),fileName);
    QDebug::operator<<(pQVar8,"not found");
    QDebug::~QDebug((QDebug *)(local_e0 + 8));
  }
  local_f8.d = (Data *)0x0;
  local_f8.ptr = (char16_t *)0x0;
  local_f8.size = 0;
LAB_002af8fb:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
LAB_002af912:
  fi.d_ptr.d.ptr._0_4_ = 0;
  fi.d_ptr.d.ptr._4_4_ = 0;
  pQVar9 = QLibraryPrivate::findOrCreate((QString *)&local_f8,(QString *)&fi,(LoadHints)loadHints.i)
  ;
  this->d = pQVar9;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fi);
  if ((undefined1 *)local_f8.size != (undefined1 *)0x0) {
    QLibraryPrivate::updatePluginState(this->d);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPluginLoader::setFileName(const QString &fileName)
{
#if defined(QT_SHARED)
    QLibrary::LoadHints lh = defaultLoadHints;
    if (d) {
        lh = d->loadHints();
        d->release();
        d = nullptr;
        did_load = false;
    }

    const QString fn = locatePlugin(fileName);

    d = QLibraryPrivate::findOrCreate(fn, QString(), lh);
    if (!fn.isEmpty())
        d->updatePluginState();

#else
    qCWarning(qt_lcDebugPlugins, "Cannot load '%ls' into a statically linked Qt library.",
              qUtf16Printable(fileName));
#endif
}